

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void absl::lts_20240722::AppendCordToString(Cord *src,Nonnull<std::string_*> dst)

{
  long lVar1;
  size_t sVar2;
  Nonnull<char_*> dst_00;
  char *append_ptr;
  size_t new_dst_size;
  size_t cur_dst_size;
  Nonnull<std::string_*> dst_local;
  Cord *src_local;
  
  lVar1 = std::__cxx11::string::size();
  sVar2 = Cord::size(src);
  strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>(dst,lVar1 + sVar2);
  dst_00 = (Nonnull<char_*>)std::__cxx11::string::operator[]((ulong)dst);
  Cord::CopyToArrayImpl(src,dst_00);
  return;
}

Assistant:

void AppendCordToString(const Cord& src, absl::Nonnull<std::string*> dst) {
  const size_t cur_dst_size = dst->size();
  const size_t new_dst_size = cur_dst_size + src.size();
  absl::strings_internal::STLStringResizeUninitializedAmortized(dst,
                                                                new_dst_size);
  char* append_ptr = &(*dst)[cur_dst_size];
  src.CopyToArrayImpl(append_ptr);
}